

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void ot::commissioner::Console::Write(string *aLine,Color aColor)

{
  int iVar1;
  ostream *poVar2;
  string local_48 [8];
  string colorCode;
  allocator local_15;
  Color local_14;
  string *psStack_10;
  Color aColor_local;
  string *aLine_local;
  
  local_14 = aColor;
  psStack_10 = aLine;
  if ((Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::kResetCode_abi_cxx11_ ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)
                                   ::kResetCode_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                kResetCode_abi_cxx11_,"\x1b[0m",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    __cxa_atexit(std::__cxx11::string::~string,
                 &Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                  kResetCode_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)::
                         kResetCode_abi_cxx11_);
  }
  std::__cxx11::string::string(local_48);
  switch(local_14) {
  case kDefault:
    std::__cxx11::string::operator=(local_48,"\x1b[0m");
    break;
  case kWhite:
    std::__cxx11::string::operator=(local_48,"\x1b[37m");
    break;
  case kRed:
    std::__cxx11::string::operator=(local_48,"\x1b[31m");
    break;
  case kGreen:
    std::__cxx11::string::operator=(local_48,"\x1b[32m");
    break;
  case kYellow:
    std::__cxx11::string::operator=(local_48,"\x1b[33m");
    break;
  case kBlue:
    std::__cxx11::string::operator=(local_48,"\x1b[34m");
    break;
  case kMagenta:
    std::__cxx11::string::operator=(local_48,"\x1b[35m");
    break;
  case kCyan:
    std::__cxx11::string::operator=(local_48,"\x1b[36m");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,local_48);
  poVar2 = std::operator<<(poVar2,(string *)psStack_10);
  poVar2 = std::operator<<(poVar2,(string *)
                                  &Write(std::__cxx11::string_const&,ot::commissioner::Console::Color)
                                   ::kResetCode_abi_cxx11_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void Console::Write(const std::string &aLine, Color aColor)
{
    static const std::string kResetCode = "\u001b[0m";
    std::string              colorCode;

    switch (aColor)
    {
    case Color::kDefault:
        colorCode = "\u001b[0m";
        break;
    case Color::kWhite:
        colorCode = "\u001b[37m";
        break;
    case Color::kRed:
        colorCode = "\u001b[31m";
        break;
    case Color::kGreen:
        colorCode = "\u001b[32m";
        break;
    case Color::kYellow:
        colorCode = "\u001b[33m";
        break;
    case Color::kBlue:
        colorCode = "\u001b[34m";
        break;
    case Color::kMagenta:
        colorCode = "\u001b[35m";
        break;
    case Color::kCyan:
        colorCode = "\u001b[36m";
        break;
    }

    std::cout << colorCode << aLine << kResetCode << std::endl;
}